

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::While_AST_Node::eval_internal(While_AST_Node *this,Dispatch_State *t_ss)

{
  byte bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  Boxed_Value BVar2;
  Break_Loop *anon_var_0;
  Continue_Loop *anon_var_0_1;
  Scope_Push_Pop spp;
  undefined7 in_stack_ffffffffffffff80;
  Dispatch_State *in_stack_ffffffffffffffb0;
  AST_Node *in_stack_ffffffffffffffb8;
  Boxed_Value *in_stack_ffffffffffffffc0;
  
  eval::detail::Scope_Push_Pop::Scope_Push_Pop((Scope_Push_Pop *)in_RDI,(Dispatch_State *)in_RDI);
  while( true ) {
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0x60),0);
    std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x26ccf9);
    AST_Node::eval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    bVar1 = AST_Node::get_bool_condition(in_stack_ffffffffffffffc0);
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x26cd27);
    if ((bVar1 & 1) == 0) break;
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0x60),1);
    std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x26cd4f);
    AST_Node::eval(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x26cd6d);
  }
  Boxed_Value::Boxed_Value((Boxed_Value *)0x26cde6);
  eval::detail::Scope_Push_Pop::~Scope_Push_Pop
            ((Scope_Push_Pop *)CONCAT17(bVar1,in_stack_ffffffffffffff80));
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE {
          chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

          try {
            while (get_bool_condition(this->children[0]->eval(t_ss))) {
              try {
                this->children[1]->eval(t_ss);
              } catch (detail::Continue_Loop &) {
                // we got a continue exception, which means all of the remaining 
                // loop implementation is skipped and we just need to continue to
                // the next condition test
              }
            } 
          } catch (detail::Break_Loop &) {
            // loop was broken intentionally
          }

          return Boxed_Value();
        }